

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::portmap_log_alert::portmap_log_alert
          (portmap_log_alert *this,stack_allocator *alloc,portmap_transport t,char *m)

{
  allocation_slot aVar1;
  rep rVar2;
  undefined7 in_register_00000011;
  allocator<char> local_21;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_00455710;
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar2;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__portmap_log_alert_00456418;
  this->map_transport = t;
  (this->m_alloc)._M_data = alloc;
  aVar1 = aux::stack_allocator::copy_string(alloc,m);
  (this->m_log_idx).m_idx = aVar1.m_idx;
  this->map_type = (int)CONCAT71(in_register_00000011,t);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,m,&local_21);
  return;
}

Assistant:

portmap_log_alert::portmap_log_alert(aux::stack_allocator& alloc
		, portmap_transport const t, const char* m)
		: map_transport(t)
		, m_alloc(alloc)
		, m_log_idx(alloc.copy_string(m))
#if TORRENT_ABI_VERSION == 1
		, map_type(static_cast<int>(t))
		, msg(m)
#endif
	{}